

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFO.cpp
# Opt level: O2

bool __thiscall UFO::logic(UFO *this,int step)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  Player *this_00;
  ResourceManager *this_01;
  Entity *this_02;
  value_type this_03;
  float fVar6;
  float fVar7;
  double dVar8;
  value_type local_20;
  
  this_00 = (Player *)Entity::getPlayerCollision(&this->super_Entity);
  if (this_00 == (Player *)0x0) {
    dVar8 = (double)al_get_time();
    if (this->nextShot < (int)(dVar8 * 1000.0)) {
      this->nextShot = (int)(dVar8 * 1000.0) + *(int *)&(this->super_Entity).field_0x34;
      this_01 = ResourceManager::getInstance();
      this_02 = (Entity *)ResourceManager::getData(this_01,1);
      fVar6 = Entity::getX(this_02);
      fVar7 = Entity::getY(this_02);
      fVar6 = atan2f(fVar7 - (this->super_Entity).y,fVar6 - (this->super_Entity).x);
      this_03 = (value_type)operator_new(0x68);
      LargeSlowBullet::LargeSlowBullet
                ((LargeSlowBullet *)this_03,(this->super_Entity).x,(this->super_Entity).y,fVar6,
                 &this->super_Entity);
      local_20 = this_03;
      std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
                (&new_entities_abi_cxx11_,&local_20);
      my_play_sample(0x1d);
    }
    piVar1 = &this->bitmapFrameCount;
    iVar2 = *piVar1;
    *piVar1 = *piVar1 - step;
    if (*piVar1 == 0 || SBORROW4(iVar2,step) != *piVar1 < 0) {
      this->bitmapFrameCount = this->ANIMATION_SPEED;
      this->bitmapFrame = (this->bitmapFrame + 1) % 3;
    }
    uVar3 = this->speed_x;
    uVar4 = this->speed_y;
    (this->super_Entity).dx = (float)step * (float)uVar3;
    (this->super_Entity).dy = (float)step * (float)uVar4;
    Entity::wrap(&this->super_Entity);
    bVar5 = Entity::logic(&this->super_Entity,step);
  }
  else {
    Entity::explode(&this->super_Entity);
    (*(this_00->super_Entity)._vptr_Entity[4])(this_00,1);
    Player::die(this_00);
    my_play_sample(0x1c);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool UFO::logic(int step)
{
   Player *p = (Player *)getPlayerCollision();
   if (p) {
      explode();
      p->hit(1);
      p->die();
      my_play_sample(RES_COLLISION);
      return false;
   }

   int now = (int) (al_get_time() * 1000.0);
   if (now > nextShot) {
      nextShot = now + SHOT_SPEED;
      ResourceManager& rm = ResourceManager::getInstance();
      Player *p = (Player *)rm.getData(RES_PLAYER);
      float px = p->getX();
      float py = p->getY();
      float shot_angle = atan2(py-y, px-x);
      LargeSlowBullet *b = new LargeSlowBullet(x, y, shot_angle, this);
      new_entities.push_back(b);
      my_play_sample(RES_FIRELARGE);
   }

   bitmapFrameCount -= step;
   if (bitmapFrameCount <= 0) {
      bitmapFrameCount = ANIMATION_SPEED;
      bitmapFrame++;
      bitmapFrame %= 3; // loop
   }
   
   dx = speed_x * step;
   dy = speed_y * step;

   Entity::wrap();

   if (!Entity::logic(step))
      return false;

   return true;
}